

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Array.cc
# Opt level: O0

pair<bool,_QPDFObjectHandle> * __thiscall
qpdf::Array::at(pair<bool,_QPDFObjectHandle> *__return_storage_ptr__,Array *this,int n)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  reference __y;
  pointer pSVar4;
  pointer ppVar5;
  _Self local_88;
  undefined1 local_80 [23];
  bool local_69;
  _Self local_68;
  _Self *local_60;
  iterator *iter;
  QPDFObjectHandle local_48;
  bool local_29;
  QPDF_Array *local_28;
  QPDF_Array *a;
  Array *pAStack_18;
  int n_local;
  Array *this_local;
  
  a._4_4_ = n;
  pAStack_18 = this;
  this_local = (Array *)__return_storage_ptr__;
  local_28 = array(this);
  iVar1 = a._4_4_;
  if ((-1 < a._4_4_) && (iVar3 = size(this), iVar1 < iVar3)) {
    bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)local_28);
    if (!bVar2) {
      iter._3_1_ = 1;
      __y = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::operator[]
                      (&local_28->elements,(long)a._4_4_);
      std::pair<bool,_QPDFObjectHandle>::pair<bool,_QPDFObjectHandle_&,_true>
                (__return_storage_ptr__,(bool *)((long)&iter + 3),__y);
      return __return_storage_ptr__;
    }
    pSVar4 = std::unique_ptr<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>::
             operator->(&local_28->sp);
    local_68._M_node =
         (_Base_ptr)
         std::
         map<int,_QPDFObjectHandle,_std::less<int>,_std::allocator<std::pair<const_int,_QPDFObjectHandle>_>_>
         ::find(&pSVar4->elements,(key_type *)((long)&a + 4));
    local_69 = true;
    local_60 = &local_68;
    pSVar4 = std::unique_ptr<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>::
             operator->(&local_28->sp);
    local_88._M_node =
         (_Base_ptr)
         std::
         map<int,_QPDFObjectHandle,_std::less<int>,_std::allocator<std::pair<const_int,_QPDFObjectHandle>_>_>
         ::end(&pSVar4->elements);
    bVar2 = std::operator==(&local_68,&local_88);
    if (bVar2) {
      null((Array *)local_80);
    }
    else {
      ppVar5 = std::_Rb_tree_iterator<std::pair<const_int,_QPDFObjectHandle>_>::operator->(local_60)
      ;
      QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)local_80,&ppVar5->second);
    }
    std::pair<bool,_QPDFObjectHandle>::pair<bool,_QPDFObjectHandle,_true>
              (__return_storage_ptr__,&local_69,(QPDFObjectHandle *)local_80);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_80);
    return __return_storage_ptr__;
  }
  local_29 = false;
  local_48.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_48.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  QPDFObjectHandle::QPDFObjectHandle(&local_48);
  std::pair<bool,_QPDFObjectHandle>::pair<bool,_true>(__return_storage_ptr__,&local_29,&local_48);
  QPDFObjectHandle::~QPDFObjectHandle(&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::pair<bool, QPDFObjectHandle>
Array::at(int n) const
{
    auto a = array();
    if (n < 0 || n >= size()) {
        return {false, {}};
    }
    if (!a->sp) {
        return {true, a->elements[size_t(n)]};
    }
    auto const& iter = a->sp->elements.find(n);
    return {true, iter == a->sp->elements.end() ? null() : iter->second};
}